

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::VariableParameter::Encode(VariableParameter *this,KDataStream *stream)

{
  byte local_19;
  KUINT8 i;
  KDataStream *stream_local;
  VariableParameter *this_local;
  
  KDataStream::operator<<(stream,this->m_ui8VarParamType);
  for (local_19 = 0; local_19 < 0xf; local_19 = local_19 + 1) {
    KDataStream::operator<<(stream,this->m_Data[local_19]);
  }
  return;
}

Assistant:

void VariableParameter::Encode( KDataStream & stream ) const
{
	stream << m_ui8VarParamType;
		
	for( KUINT8 i = 0; i < 15; ++i )
	{
		stream << m_Data[i];
	}
}